

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOGetScalarArray(FmsIOContext *ctx,char *path,FmsScalarType *type,void **values,FmsInt *n)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulonglong uVar4;
  int *piVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  char *newoff;
  ulong local_448;
  ulong *local_440;
  char v [512];
  char k [512];
  
  if (ctx == (FmsIOContext *)0x0) {
    iVar1 = 1;
  }
  else if (path == (char *)0x0) {
    iVar1 = 2;
  }
  else if (type == (FmsScalarType *)0x0) {
    iVar1 = 3;
  }
  else if (values == (void **)0x0) {
    iVar1 = 4;
  }
  else if (n == (FmsInt *)0x0) {
    iVar1 = 5;
  }
  else {
    iVar1 = FmsIOReadKeyValue(ctx,k,v);
    if (iVar1 == 0) {
      local_440 = n;
      pcVar3 = join_keys(path,"Size");
      iVar1 = strcmp(k,pcVar3);
      free(pcVar3);
      if (iVar1 == 0) {
        iVar1 = 10;
        uVar4 = strtoull(v,(char **)0x0,10);
        *local_440 = uVar4;
        piVar5 = __errno_location();
        if (*piVar5 == 0x22) {
          iVar1 = 8;
        }
        else if (*piVar5 == 0x16) {
          iVar1 = 9;
        }
        else {
          iVar2 = FmsIOReadKeyValue(ctx,k,v);
          if (iVar2 == 0) {
            pcVar3 = join_keys(path,"Type");
            iVar1 = strcmp(k,pcVar3);
            free(pcVar3);
            if (iVar1 == 0) {
              iVar1 = FmsGetScalarTypeFromName(v,type);
              if (iVar1 == 0) {
                if (*local_440 != 0) {
                  iVar1 = FmsIOReadKeyValue(ctx,k,v);
                  if (iVar1 != 0) {
                    return 0xe;
                  }
                  pcVar3 = join_keys(path,"Values");
                  iVar1 = strcmp(k,pcVar3);
                  free(pcVar3);
                  if (iVar1 != 0) {
                    return 0xf;
                  }
                  switch(*type) {
                  case FMS_FLOAT:
                    pvVar6 = malloc(*local_440 << 2);
                    local_448 = 0;
                    do {
                      uVar8 = local_448;
                      sVar7 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar9 = local_448;
                        if ((sVar7 == 0) || (uVar9 = uVar8, *local_440 <= uVar8)) break;
                        fVar10 = strtof(pcVar3,&newoff);
                        *(float *)((long)pvVar6 + uVar8 * 4) = fVar10;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar8 = uVar8 + 1;
                        uVar9 = uVar8;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar7);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar9, iVar1 == 0));
                    break;
                  case FMS_DOUBLE:
                    pvVar6 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar8 = local_448;
                      sVar7 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar9 = local_448;
                        if ((sVar7 == 0) || (uVar9 = uVar8, *local_440 <= uVar8)) break;
                        dVar11 = strtod(pcVar3,&newoff);
                        *(double *)((long)pvVar6 + uVar8 * 8) = dVar11;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar8 = uVar8 + 1;
                        uVar9 = uVar8;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar7);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar9, iVar1 == 0));
                    break;
                  case FMS_COMPLEX_FLOAT:
                    pvVar6 = malloc(*local_440 << 3);
                    local_448 = 0;
                    do {
                      uVar8 = local_448;
                      sVar7 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar9 = local_448;
                        if ((sVar7 == 0) || (uVar9 = uVar8, *local_440 * 2 <= uVar8)) break;
                        fVar10 = strtof(pcVar3,&newoff);
                        *(float *)((long)pvVar6 + uVar8 * 4) = fVar10;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar8 = uVar8 + 1;
                        uVar9 = uVar8;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar7);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar9, iVar1 == 0));
                    break;
                  case FMS_COMPLEX_DOUBLE:
                    pvVar6 = malloc(*local_440 << 4);
                    local_448 = 0;
                    do {
                      uVar8 = local_448;
                      sVar7 = strlen(v);
                      newoff = (char *)0x0;
                      pcVar3 = v + (v[0] == '[');
                      do {
                        uVar9 = local_448;
                        if ((sVar7 == 0) || (uVar9 = uVar8, *local_440 * 2 <= uVar8)) break;
                        dVar11 = strtod(pcVar3,&newoff);
                        *(double *)((long)pvVar6 + uVar8 * 8) = dVar11;
                        pcVar3 = newoff + 1;
                        if (newoff[1] == ' ') {
                          pcVar3 = newoff + 2;
                        }
                        uVar8 = uVar8 + 1;
                        uVar9 = uVar8;
                        newoff = pcVar3;
                      } while (pcVar3 < v + sVar7);
                      pcVar3 = strchr(v,0x5d);
                    } while ((pcVar3 == (char *)0x0) &&
                            (iVar1 = FmsIOReadLine(ctx,v), local_448 = uVar9, iVar1 == 0));
                    break;
                  default:
                    return 0x10;
                  }
                  *values = pvVar6;
                }
                iVar1 = 0;
              }
              else {
                iVar1 = 0xc;
              }
            }
            else {
              iVar1 = 0xb;
            }
          }
        }
      }
      else {
        iVar1 = 7;
      }
    }
    else {
      iVar1 = 6;
    }
  }
  return iVar1;
}

Assistant:

static int
FmsIOGetScalarArray(FmsIOContext *ctx, const char *path, FmsScalarType *type,
                    void **values, FmsInt *n) {
  int err = 0;
  char k[FMS_BUFFER_SIZE], v[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);
  if(!type) E_RETURN(3);
  if(!values) E_RETURN(4);
  if(!n) E_RETURN(5);

  /* Arrays are written like:
      path/Size: n
      path/Type: type
      path/Values: [1,2,3,
      4,5,6
      7,8,9]
  */

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(6);

    char *ksize = join_keys(path, "Size");
    err = strcmp(k, ksize);
    FREE(ksize);
    // Path & key didn't match
    if(err)
      E_RETURN(7);

    *n = StrToFmsInt(v, NULL, 10);

    if (errno == ERANGE) { E_RETURN(8); }
    if (errno == EINVAL) { E_RETURN(9); }
  }

  {
    // Error reading line
    if(FmsIOReadKeyValue(ctx, k, v))
      E_RETURN(10);

    char *ktype= join_keys(path, "Type");
    err = strcmp(k, ktype);
    FREE(ktype);
    // Path & key didn't match
    if(err)
      E_RETURN(11);

    if(FmsGetScalarTypeFromName(v, type))
      E_RETURN(12);
  }

  // Values does not get written if Size == 0
  if(*n == 0)
    return 0;

  if(FmsIOReadKeyValue(ctx, k, v))
    E_RETURN(14);

  char *kvalues = join_keys(path, "Values");
  err = strcmp(k, kvalues);
  FREE(kvalues);
  if(err)
    E_RETURN(15);

// Had to remake this for scalar because strto(f/d) doesn't take a base
#define READ_ARRAY_DATA(DEST_T, FUNC, SIZE) \
do { \
    DEST_T *data = malloc(sizeof(DEST_T) * SIZE); \
    FmsInt i = 0; \
    while(1) { \
        size_t len = strlen(v); \
        char *off = v, *newoff = NULL; \
        if(off[0] == '[') \
            off++; \
        while(len && i < SIZE) { \
            data[i++] = (DEST_T)FUNC(off, &newoff); \
            newoff++; \
            if(*newoff == ' ') newoff++; /* Current flaw in the file format, last element has no trialing space */ \
            if(newoff >= v + len) break; \
            off = newoff; \
        }